

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O2

int grisu3_i_to_str(int val,char *str)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = (int)str;
  if (val < 0) {
    *str = '-';
    val = -val;
    str = str + 1;
  }
  uVar5 = 0;
  lVar8 = -0x100000000;
  do {
    str[uVar5] = (char)((uint)val / 10) * -10 + (char)val + '0';
    lVar8 = lVar8 + 0x100000000;
    uVar5 = uVar5 + 1;
    bVar2 = 9 < (uint)val;
    val = (uint)val / 10;
  } while (bVar2);
  str[uVar5] = '\0';
  uVar3 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 2;
  uVar6 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    cVar1 = str[uVar6];
    str[uVar6] = str[lVar8 >> 0x20];
    str[lVar8 >> 0x20] = cVar1;
    lVar8 = lVar8 + -0x100000000;
  }
  return (int)uVar5 + ((int)str - iVar7);
}

Assistant:

static int grisu3_i_to_str(int val, char *str)
{
    int len, i;
    char *s;
    char *begin = str;
    if (val < 0) { *str++ = '-'; val = -val; }
    s = str;

    for(;;)
    {
        int ni = val / 10;
        int digit = val - ni*10;
        *s++ = (char)('0' + digit);
        if (ni == 0)
            break;
        val = ni;
    }
    *s = '\0';
    len = (int)(s - str);
    for(i = 0; i < len/2; ++i)
    {
        char ch = str[i];
        str[i] = str[len-1-i];
        str[len-1-i] = ch;
    }

    return (int)(s - begin);
}